

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  uint64_t id_00;
  Which WVar1;
  RawSchema *value;
  char (*in_R8) [2];
  TryGetResult TVar2;
  anon_class_1_0_00000001 local_d1;
  String local_d0;
  ArrayPtr<const_char> local_b8;
  anon_class_1_0_00000001 local_a5 [13];
  ArrayPtr<const_char> local_98;
  uint local_88;
  uint local_84;
  Fault local_80;
  Fault f;
  Reader node;
  RawSchema *existing;
  uint64_t uStack_28;
  Which expectedKind_local;
  uint64_t id_local;
  Validator *this_local;
  
  uStack_28 = id;
  id_local = (uint64_t)this;
  TVar2 = SchemaLoader::Impl::tryGet(this->loader,id);
  id_00 = uStack_28;
  node._reader._40_8_ = TVar2.schema;
  if (node._reader._40_8_ == 0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              (&local_d0,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x539b57,in_R8);
    kj::StringPtr::StringPtr((StringPtr *)&local_b8,&local_d0);
    value = SchemaLoader::Impl::loadEmpty(this_00,id_00,(StringPtr)local_b8,expectedKind,true);
    kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
    upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>
              ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,id_00,value,
               &local_d1);
    kj::String::~String(&local_d0);
  }
  else {
    readMessageUnchecked<capnp::schema::Node>((Reader *)&f,*(word **)(node._reader._40_8_ + 8));
    WVar1 = capnp::schema::Node::Reader::which((Reader *)&f);
    if (WVar1 == expectedKind) {
      kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::
      upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>
                ((TreeMap<unsigned_long,capnp::_::RawSchema*> *)&this->dependencies,uStack_28,
                 (RawSchema *)node._reader._40_8_,local_a5);
    }
    else {
      local_84 = (uint)expectedKind;
      WVar1 = capnp::schema::Node::Reader::which((Reader *)&f);
      local_88 = (uint)WVar1;
      local_98 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)&f);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x25d,FAILED,"node.which() == expectedKind",
                 "\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,(char (*) [46])"expected a different kind of node for this ID",
                 &stack0xffffffffffffffd8,&local_84,&local_88,(Reader *)&local_98);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&local_80);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }